

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_mdtm_resp(Curl_easy *data,int ftpcode)

{
  uchar uVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  time_t tVar5;
  pingpong **second_00;
  undefined8 uVar6;
  undefined4 uVar7;
  int local_16c;
  tm *tm;
  tm buffer;
  time_t filetime;
  char local_108 [4];
  int headerbuflen;
  char headerbuf [128];
  char timebuf [24];
  char *resp;
  pingpong *pp;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  CURLcode result;
  int ftpcode_local;
  Curl_easy *data_local;
  
  ftp._0_4_ = CURLE_OK;
  conn = (connectdata *)(data->req).p.file;
  ftpc = (ftp_conn *)data->conn;
  _month = &((connectdata *)ftpc)->proto;
  ftp._4_4_ = ftpcode;
  _result = data;
  if (ftpcode == 0xd5) {
    pcVar4 = Curl_dyn_ptr(&(((connectdata *)ftpc)->proto).ftpc.pp.recvbuf);
    second_00 = &pp;
    _Var2 = ftp_213_date(pcVar4 + 4,&day,&hour,&minute,&second,(int *)((long)&pp + 4),
                         (int *)second_00);
    uVar7 = (undefined4)((ulong)second_00 >> 0x20);
    if (_Var2) {
      uVar6 = CONCAT44(uVar7,second);
      curl_msnprintf(headerbuf + 0x78,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)day,
                     (ulong)(uint)hour,(ulong)(uint)minute,uVar6,pp._4_4_,pp._0_4_);
      uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
      tVar5 = Curl_getdate_capped(headerbuf + 0x78);
      (_result->info).filetime = tVar5;
    }
    if (((((*(uint *)&(_result->req).field_0xd9 >> 0x11 & 1) != 0) &&
         ((_month->ftpc).file != (char *)0x0)) &&
        ((*(ulong *)&(_result->set).field_0x8ca >> 7 & 1) != 0)) && (-1 < (_result->info).filetime))
    {
      buffer.tm_zone = (char *)(_result->info).filetime;
      ftp._0_4_ = Curl_gmtime((time_t)buffer.tm_zone,(tm *)&tm);
      if ((CURLcode)ftp != CURLE_OK) {
        return (CURLcode)ftp;
      }
      if (buffer.tm_mon == 0) {
        local_16c = 6;
      }
      else {
        local_16c = buffer.tm_mon + -1;
      }
      iVar3 = curl_msnprintf(local_108,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                             Curl_wkday[local_16c],(ulong)(uint)buffer.tm_min,
                             Curl_month[buffer.tm_hour],CONCAT44(uVar7,buffer.tm_mday + 0x76c),
                             buffer.tm_sec,tm._4_4_,tm._0_4_);
      ftp._0_4_ = client_write_header(_result,local_108,(long)iVar3);
      if ((CURLcode)ftp != CURLE_OK) {
        return (CURLcode)ftp;
      }
    }
  }
  else if (ftpcode == 0x226) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"MDTM failed: file does not exist or permission problem, continuing");
    }
  }
  else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) {
    Curl_infof(data,"unsupported MDTM reply format");
  }
  if ((_result->set).timecondition != '\0') {
    if (((_result->info).filetime < 1) || ((_result->set).timevalue < 1)) {
      if (((_result != (Curl_easy *)0x0) &&
          ((*(ulong *)&(_result->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((_result->state).feat == (curl_trc_feat *)0x0 || (0 < ((_result->state).feat)->log_level)
          ))) {
        Curl_infof(_result,"Skipping time comparison");
      }
    }
    else {
      uVar1 = (_result->set).timecondition;
      if ((uVar1 == '\x01') || (uVar1 != '\x02')) {
        if ((_result->info).filetime <= (_result->set).timevalue) {
          if (((_result != (Curl_easy *)0x0) &&
              ((*(ulong *)&(_result->set).field_0x8ca >> 0x1c & 1) != 0)) &&
             (((_result->state).feat == (curl_trc_feat *)0x0 ||
              (0 < ((_result->state).feat)->log_level)))) {
            Curl_infof(_result,"The requested document is not new enough");
          }
          *(undefined4 *)&(conn->cpool_node)._prev = 2;
          (_result->info).field_0xe4 = (_result->info).field_0xe4 & 0xfe | 1;
          _ftp_state(_result,'\0');
          return CURLE_OK;
        }
      }
      else if ((_result->set).timevalue < (_result->info).filetime) {
        if (((_result != (Curl_easy *)0x0) &&
            ((*(ulong *)&(_result->set).field_0x8ca >> 0x1c & 1) != 0)) &&
           (((_result->state).feat == (curl_trc_feat *)0x0 ||
            (0 < ((_result->state).feat)->log_level)))) {
          Curl_infof(_result,"The requested document is not old enough");
        }
        *(undefined4 *)&(conn->cpool_node)._prev = 2;
        (_result->info).field_0xe4 = (_result->info).field_0xe4 & 0xfe | 1;
        _ftp_state(_result,'\0');
        return CURLE_OK;
      }
    }
  }
  if ((CURLcode)ftp == CURLE_OK) {
    ftp._0_4_ = ftp_state_type(_result);
  }
  return (CURLcode)ftp;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      struct pingpong *pp = &ftpc->pp;
      char *resp = Curl_dyn_ptr(&pp->recvbuf) + 4;
      if(ftp_213_date(resp, &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = Curl_getdate_capped(timebuf);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" an HTTP-style header in our output. */

      if(data->req.no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
        char headerbuf[128];
        int headerbuflen;
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        headerbuflen =
          msnprintf(headerbuf, sizeof(headerbuf),
                    "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                    Curl_wkday[tm->tm_wday ? tm->tm_wday-1 : 6],
                    tm->tm_mday,
                    Curl_month[tm->tm_mon],
                    tm->tm_year + 1900,
                    tm->tm_hour,
                    tm->tm_min,
                    tm->tm_sec);
        result = client_write_header(data, headerbuf, headerbuflen);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format");
    break;
  case 550: /* 550 is used for several different problems, e.g.
               "No such file or directory" or "Permission denied".
               It does not mean that the file does not exist at all. */
    infof(data, "MDTM failed: file does not exist or permission problem,"
          " continuing");
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          ftp_state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          ftp_state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison");
    }
  }

  if(!result)
    result = ftp_state_type(data);

  return result;
}